

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::MatrixAccumulator::add(MatrixAccumulator *this,ElementType *val)

{
  undefined8 uVar1;
  double *pdVar2;
  RectMatrix<double,_3U,_3U> *in_RSI;
  long in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint j;
  uint i;
  undefined4 local_18;
  undefined4 local_14;
  
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x58),local_14,local_18);
      dVar5 = *pdVar2;
      uVar1 = *(undefined8 *)(in_RDI + 8);
      auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar6._0_8_ = uVar1;
      auVar6._12_4_ = 0x45300000;
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x58),local_14,local_18);
      *pdVar2 = *pdVar2 + (dVar3 - dVar5) /
                          ((auVar6._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      dVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0xa0),local_14,local_18);
      dVar5 = *pdVar2;
      uVar1 = *(undefined8 *)(in_RDI + 8);
      auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0xa0),local_14,local_18);
      *pdVar2 = (dVar3 * dVar4 - dVar5) /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) + *pdVar2;
      dVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x10),local_14,local_18);
      *pdVar2 = dVar5;
      dVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0xe8),local_14,local_18);
      *pdVar2 = dVar5 + *pdVar2;
    }
  }
  return;
}

Assistant:

void add(ElementType const& val) {
      Count_++;
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          Avg_(i, j) += (val(i, j) - Avg_(i, j)) / Count_;
          Avg2_(i, j) += (val(i, j) * val(i, j) - Avg2_(i, j)) / Count_;
          Val_(i, j) = val(i, j);
          Total_(i, j) += val(i, j);
        }
      }
    }